

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

void load_frames(char *fn,int start,int n_frame,int x,int y,qnode_ptr_t cub,int bin)

{
  ulong uVar1;
  uchar hd [32];
  string s2;
  string s1;
  uchar local_f8 [32];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < n_frame) {
    uVar1 = 0;
    do {
      sprintf(local_88,"%d",(ulong)(uint)((int)uVar1 + start));
      concat(fn,local_88,local_d8);
      if (bin == 0) {
        pgetrast(local_d8,local_f8,*cub->gauss_ptr[uVar1],x,y,0x13c);
      }
      else {
        Bpgetrast(local_d8,*cub->gauss_ptr[uVar1],x,y,0x13c);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)n_frame != uVar1);
  }
  return;
}

Assistant:

void load_frames(fn,start,n_frame,x,y,cub,bin)
string fn ;
int start, n_frame, x, y, bin ;
qnode_ptr_t cub ;

{ unsigned char hd[H] ;
  string s1, s2 ;
  int i ;

  for (i = 0 ; i < n_frame ; i++) {
    sprintf(s1,"%d",start);
    concat(fn,s1,s2) ;
    if (!bin) {
      pgetrast(s2,hd,cub->gauss_ptr[i],x,y,X) ;
    }
    else {
      Bpgetrast(s2,cub->gauss_ptr[i],x,y,X) ;
    }
    start++ ;
  }
}